

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O0

void __thiscall QStringListModel::sort(QStringListModel *this,int param_2,SortOrder order)

{
  iterator __last;
  iterator __last_00;
  int iVar1;
  qsizetype qVar2;
  reference piVar3;
  const_reference this_00;
  const_reference piVar4;
  int in_EDX;
  long *in_RDI;
  long in_FS_OFFSET;
  int i_2;
  int numOldIndexes;
  int i_1;
  int lstCount;
  QModelIndexList newList;
  QModelIndexList oldList;
  QList<int> forwarding;
  int i;
  QList<std::pair<QString,_int>_> list;
  rvalue_ref in_stack_fffffffffffffe38;
  QList<std::pair<QString,_int>_> *in_stack_fffffffffffffe40;
  qsizetype in_stack_fffffffffffffe48;
  LayoutChangeHint _t2;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int iVar5;
  iterator in_stack_fffffffffffffe58;
  undefined1 *puVar6;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  iterator in_stack_fffffffffffffe80;
  QList<std::pair<QString,_int>_> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffeb8;
  int iVar7;
  int iVar8;
  iterator in_stack_fffffffffffffec8;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined1 local_d8 [24];
  undefined1 local_c0 [24];
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  QList<QModelIndex> local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  int local_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x8bb8b8);
  QAbstractItemModel::layoutAboutToBeChanged
            ((QAbstractItemModel *)in_stack_fffffffffffffe40,
             (QList<QPersistentModelIndex> *)in_stack_fffffffffffffe38,
             (LayoutChangeHint)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x8bb8db);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QList<std::pair<QString,_int>_>::QList((QList<std::pair<QString,_int>_> *)0x8bb90e);
  qVar2 = QList<QString>::size((QList<QString> *)(in_RDI + 2));
  QList<std::pair<QString,_int>_>::reserve
            (in_stack_fffffffffffffe88,(qsizetype)in_stack_fffffffffffffec8.i);
  for (local_4c = 0; local_4c < (int)qVar2; local_4c = local_4c + 1) {
    QList<QString>::at((QList<QString> *)in_stack_fffffffffffffe40,
                       (qsizetype)in_stack_fffffffffffffe38);
    QList<std::pair<QString,int>>::emplace_back<QString_const&,int&>
              (in_stack_fffffffffffffe40,(QString *)in_stack_fffffffffffffe38,(int *)0x8bb984);
  }
  if (in_EDX == 0) {
    QList<std::pair<QString,_int>_>::begin(in_stack_fffffffffffffe40);
    QList<std::pair<QString,_int>_>::end(in_stack_fffffffffffffe40);
    __last.i._4_4_ = in_stack_fffffffffffffe54;
    __last.i._0_4_ = in_stack_fffffffffffffe50;
    std::
    sort<QList<std::pair<QString,int>>::iterator,bool(*)(std::pair<QString,int>const&,std::pair<QString,int>const&)>
              (in_stack_fffffffffffffe58,__last,
               (_func_bool_pair<QString,_int>_ptr_pair<QString,_int>_ptr *)in_stack_fffffffffffffe38
              );
  }
  else {
    QList<std::pair<QString,_int>_>::begin(in_stack_fffffffffffffe40);
    in_stack_fffffffffffffe80 = QList<std::pair<QString,_int>_>::end(in_stack_fffffffffffffe40);
    __last_00.i._4_4_ = in_stack_fffffffffffffe54;
    __last_00.i._0_4_ = in_stack_fffffffffffffe50;
    in_stack_fffffffffffffec8 = in_stack_fffffffffffffe80;
    std::
    sort<QList<std::pair<QString,int>>::iterator,bool(*)(std::pair<QString,int>const&,std::pair<QString,int>const&)>
              (in_stack_fffffffffffffe58,__last_00,
               (_func_bool_pair<QString,_int>_ptr_pair<QString,_int>_ptr *)in_stack_fffffffffffffe38
              );
  }
  QList<QString>::clear((QList<QString> *)in_stack_fffffffffffffe40);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    in_stack_fffffffffffffe48);
  for (iVar8 = 0; iVar8 < (int)qVar2; iVar8 = iVar8 + 1) {
    QList<std::pair<QString,_int>_>::at
              (in_stack_fffffffffffffe40,(qsizetype)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe6c = iVar8;
    QList<QString>::append
              ((QList<QString> *)in_stack_fffffffffffffe40,(parameter_type)in_stack_fffffffffffffe38
              );
    iVar8 = in_stack_fffffffffffffe6c;
    QList<std::pair<QString,_int>_>::at
              (in_stack_fffffffffffffe40,(qsizetype)in_stack_fffffffffffffe38);
    piVar3 = QList<int>::operator[]
                       ((QList<int> *)in_stack_fffffffffffffe40,(qsizetype)in_stack_fffffffffffffe38
                       );
    *piVar3 = in_stack_fffffffffffffe6c;
  }
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemModel::persistentIndexList((QAbstractItemModel *)in_stack_fffffffffffffe80.i);
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x8bbc22);
  qVar2 = QList<QModelIndex>::size(&local_88);
  iVar1 = (int)qVar2;
  QList<QModelIndex>::reserve
            ((QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (qsizetype)in_RDI);
  for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
    this_00 = QList<QModelIndex>::at
                        ((QList<QModelIndex> *)in_stack_fffffffffffffe40,
                         (qsizetype)in_stack_fffffffffffffe38);
    QModelIndex::row(this_00);
    piVar4 = QList<int>::at((QList<int> *)in_stack_fffffffffffffe40,
                            (qsizetype)in_stack_fffffffffffffe38);
    iVar5 = *piVar4;
    puVar6 = local_d8;
    QModelIndex::QModelIndex((QModelIndex *)0x8bbcae);
    (**(code **)(*in_RDI + 0x60))(local_c0,in_RDI,iVar5,0,puVar6);
    QList<QModelIndex>::append
              ((QList<QModelIndex> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  QAbstractItemModel::changePersistentIndexList
            ((QAbstractItemModel *)in_stack_fffffffffffffec8.i,
             (QModelIndexList *)CONCAT44(iVar8,iVar1),
             (QModelIndexList *)CONCAT44(iVar7,in_stack_fffffffffffffeb8));
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  _t2 = (LayoutChangeHint)((ulong)&local_f8 >> 0x20);
  QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x8bbd62);
  QAbstractItemModel::layoutChanged
            ((QAbstractItemModel *)in_stack_fffffffffffffe40,
             (QList<QPersistentModelIndex> *)in_stack_fffffffffffffe38,_t2);
  QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x8bbd85);
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8bbd92);
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8bbd9f);
  QList<int>::~QList((QList<int> *)0x8bbdac);
  QList<std::pair<QString,_int>_>::~QList((QList<std::pair<QString,_int>_> *)0x8bbdb9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStringListModel::sort(int, Qt::SortOrder order)
{
    emit layoutAboutToBeChanged(QList<QPersistentModelIndex>(), VerticalSortHint);

    QList<std::pair<QString, int>> list;
    const int lstCount = lst.size();
    list.reserve(lstCount);
    for (int i = 0; i < lstCount; ++i)
        list.emplace_back(lst.at(i), i);

    if (order == Qt::AscendingOrder)
        std::sort(list.begin(), list.end(), ascendingLessThan);
    else
        std::sort(list.begin(), list.end(), decendingLessThan);

    lst.clear();
    QList<int> forwarding(lstCount);
    for (int i = 0; i < lstCount; ++i) {
        lst.append(list.at(i).first);
        forwarding[list.at(i).second] = i;
    }

    QModelIndexList oldList = persistentIndexList();
    QModelIndexList newList;
    const int numOldIndexes = oldList.size();
    newList.reserve(numOldIndexes);
    for (int i = 0; i < numOldIndexes; ++i)
        newList.append(index(forwarding.at(oldList.at(i).row()), 0));
    changePersistentIndexList(oldList, newList);

    emit layoutChanged(QList<QPersistentModelIndex>(), VerticalSortHint);
}